

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O3

void duckdb_mbedtls::MbedTlsWrapper::ComputeSha256Hash(char *in,size_t in_len,char *out)

{
  int iVar1;
  runtime_error *this;
  mbedtls_sha256_context sha_context;
  mbedtls_sha256_context mStack_88;
  
  mbedtls_sha256_init(&mStack_88);
  iVar1 = mbedtls_sha256_starts(&mStack_88,0);
  if (iVar1 == 0) {
    iVar1 = mbedtls_sha256_update(&mStack_88,(uchar *)in,in_len);
    if (iVar1 == 0) {
      iVar1 = mbedtls_sha256_finish(&mStack_88,(uchar *)out);
      if (iVar1 == 0) {
        mbedtls_sha256_free(&mStack_88);
        return;
      }
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"SHA256 Error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::ComputeSha256Hash(const char *in, size_t in_len, char *out) {

	mbedtls_sha256_context sha_context;
	mbedtls_sha256_init(&sha_context);
	if (mbedtls_sha256_starts(&sha_context, false) ||
	    mbedtls_sha256_update(&sha_context, reinterpret_cast<const unsigned char *>(in), in_len) ||
	    mbedtls_sha256_finish(&sha_context, reinterpret_cast<unsigned char *>(out))) {
		throw runtime_error("SHA256 Error");
	}
	mbedtls_sha256_free(&sha_context);
}